

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::Argument<2ul,0ul,1ul>(Argument *this,string *a)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  bool local_a1;
  undefined1 local_22 [2];
  string *local_20;
  string (*a_local) [2];
  Argument *this_local;
  
  local_20 = a;
  a_local = (string (*) [2])this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mNames);
  std::__cxx11::string::string((string *)&this->mUsedName);
  std::__cxx11::string::string((string *)&this->mHelp);
  std::any::any(&this->mDefaultValue);
  std::any::any(&this->mImplicitValue);
  std::
  variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
  ::
  variant<std::function<std::any(std::__cxx11::string_const&)>,argparse::Argument::mAction::_lambda(std::__cxx11::string_const&)_1_,void>
            ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
              *)&this->mAction,local_22);
  std::vector<std::any,_std::allocator<std::any>_>::vector(&this->mValues);
  this->mNumArgs = 1;
  bVar1 = is_optional(local_20);
  local_a1 = true;
  if (!bVar1) {
    local_a1 = is_optional(local_20 + 1);
  }
  this->field_0xbc = this->field_0xbc & 0xfe | local_a1;
  this->field_0xbc = this->field_0xbc & 0xfd;
  this->field_0xbc = this->field_0xbc & 0xfb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->mNames,local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->mNames,local_20 + 1);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->mNames);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->mNames);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argparse::Argument::Argument<2ul,0ul,1ul>(std::__cxx11::string(&&)[2ul],std::integer_sequence<unsigned_long,0ul,1ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar2._M_current,iVar3._M_current);
  return;
}

Assistant:

explicit Argument(std::string(&&a)[N], std::index_sequence<I...>)
      : mIsOptional((is_optional(a[I]) || ...)), mIsRequired(false),
        mIsUsed(false) {
    ((void)mNames.push_back(std::move(a[I])), ...);
    std::sort(
        mNames.begin(), mNames.end(), [](const auto &lhs, const auto &rhs) {
          return lhs.size() == rhs.size() ? lhs < rhs : lhs.size() < rhs.size();
        });
  }